

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_edge_tec_zone(REF_GRID ref_grid,REF_INT id,FILE *file)

{
  int node;
  REF_NODE pRVar1;
  REF_GEOM ref_geom;
  REF_INT *pRVar2;
  REF_DBL *pRVar3;
  bool bVar4;
  FILE *__stream;
  uint uVar5;
  REF_STATUS RVar6;
  REF_DBL *pRVar7;
  long lVar8;
  ulong uVar9;
  undefined8 uVar10;
  long lVar11;
  REF_INT RVar12;
  int iVar13;
  ulong uVar14;
  REF_CELL ref_cell;
  REF_INT local;
  REF_INT sens;
  REF_DICT ref_dict;
  REF_DBL radius;
  REF_DBL gap;
  REF_DBL tvalue;
  REF_DBL xyz [3];
  REF_INT nodes [27];
  REF_DBL normal [3];
  uint local_144;
  int local_140;
  int local_13c;
  REF_DICT local_138;
  REF_DBL local_130;
  REF_DBL *local_128;
  ulong local_120;
  FILE *local_118;
  REF_DBL local_110;
  REF_DBL local_108;
  ulong local_100;
  REF_DBL local_f8;
  REF_DBL local_f0;
  REF_DBL local_e8;
  REF_NODE local_d8;
  ulong local_d0;
  REF_CELL local_c8;
  ulong local_c0;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  REF_DBL local_48 [3];
  
  pRVar1 = ref_grid->node;
  ref_cell = ref_grid->cell[0];
  ref_geom = ref_grid->geom;
  uVar5 = ref_dict_create(&local_138);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xb92,
           "ref_geom_edge_tec_zone",(ulong)uVar5,"create dict");
    return uVar5;
  }
  local_118 = (FILE *)file;
  local_d8 = pRVar1;
  if (ref_geom->max < 1) {
    uVar9 = 0xffffffff;
  }
  else {
    uVar9 = 0xffffffff;
    lVar11 = 0;
    uVar14 = 0;
    local_c8 = ref_cell;
    do {
      pRVar2 = ref_geom->descr;
      if ((*(int *)((long)pRVar2 + lVar11) == 1) && (*(int *)((long)pRVar2 + lVar11 + 4) == id)) {
        uVar5 = ref_dict_store(local_138,*(REF_INT *)((long)pRVar2 + lVar11 + 0x14),(REF_INT)uVar14)
        ;
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xb97,"ref_geom_edge_tec_zone",(ulong)uVar5,"mark nodes");
          return uVar5;
        }
        ref_cell = local_c8;
        if (*(int *)((long)ref_geom->descr + lVar11 + 0xc) != 0) {
          if ((int)uVar9 != -1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xb99,"ref_geom_edge_tec_zone","should be only one jump per edge",
                   0xffffffffffffffff,(long)(int)uVar9);
            return 1;
          }
          uVar9 = uVar14 & 0xffffffff;
        }
      }
      uVar14 = uVar14 + 1;
      lVar11 = lVar11 + 0x18;
    } while ((long)uVar14 < (long)ref_geom->max);
  }
  local_120 = (ulong)((uint)((int)uVar9 != -1) + local_138->n);
  local_c0 = uVar9;
  if (ref_cell->max < 1) {
    uVar5 = 0;
  }
  else {
    RVar12 = 0;
    uVar5 = 0;
    do {
      RVar6 = ref_cell_nodes(ref_cell,RVar12,(REF_INT *)&local_b8);
      uVar5 = uVar5 + (local_b0 == id && RVar6 == 0);
      RVar12 = RVar12 + 1;
    } while (RVar12 < ref_cell->max);
  }
  uVar9 = local_120;
  iVar13 = (int)local_120;
  if ((iVar13 == 0) || (uVar5 == 0)) {
    uVar5 = ref_dict_free(local_138);
    if (uVar5 == 0) {
      return 0;
    }
    uVar10 = 0xbaa;
  }
  else {
    fprintf(local_118,"zone t=\"edge%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",id,
            local_120 & 0xffffffff,(ulong)uVar5,"point","felineseg");
    if (iVar13 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xbb3,
             "ref_geom_edge_tec_zone","malloc t of REF_DBL negative");
      return 1;
    }
    uVar9 = uVar9 & 0xffffffff;
    pRVar7 = (REF_DBL *)malloc(uVar9 * 8);
    local_128 = pRVar7;
    if (pRVar7 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xbb3,
             "ref_geom_edge_tec_zone","malloc t of REF_DBL NULL");
      return 2;
    }
    local_d0 = uVar9;
    if (0 < ref_cell->max) {
      local_100 = CONCAT44(local_100._4_4_,iVar13 + -1);
      RVar12 = 0;
      local_144 = 0;
      do {
        RVar6 = ref_cell_nodes(ref_cell,RVar12,(REF_INT *)&local_b8);
        if ((RVar6 == 0) && (local_b0 == id)) {
          uVar5 = ref_dict_location(local_138,local_b8,&local_140);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xbba,"ref_geom_edge_tec_zone",(ulong)uVar5,"localize");
            printf("edg %d %d id %d no edge geom\n",(ulong)local_b8,(ulong)local_b4,(ulong)local_b0)
            ;
            local_144 = ref_node_location(local_d8,local_b8);
            pRVar7 = local_128;
            if (local_144 == 0) {
              ref_geom_tattle(ref_geom,local_b8);
              local_144 = uVar5;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,3000,"ref_geom_edge_tec_zone",(ulong)local_144,"loc");
              pRVar7 = local_128;
            }
          }
          if (uVar5 != 0) {
            return local_144;
          }
          uVar5 = ref_geom_cell_tuv(ref_geom,local_b8,(REF_INT *)&local_b8,1,&local_108,&local_13c);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xbbd,"ref_geom_edge_tec_zone",(ulong)uVar5,"from");
            return uVar5;
          }
          if (local_13c == -1) {
            local_140 = (int)local_100;
          }
          pRVar7[local_140] = local_108;
          uVar5 = ref_dict_location(local_138,local_b4,&local_140);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xbc0,"ref_geom_edge_tec_zone",(ulong)uVar5,"localize");
            return uVar5;
          }
          uVar5 = ref_geom_cell_tuv(ref_geom,local_b4,(REF_INT *)&local_b8,1,&local_108,&local_13c);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xbc3,"ref_geom_edge_tec_zone",(ulong)uVar5);
            return uVar5;
          }
          if (local_13c == -1) {
            local_140 = (int)local_100;
          }
          pRVar7[local_140] = local_108;
        }
        RVar12 = RVar12 + 1;
      } while (RVar12 < ref_cell->max);
    }
    RVar12 = -1;
    uVar9 = 0xffffffff;
    if (0 < local_138->n) {
      uVar9 = (ulong)(uint)*local_138->key;
      RVar12 = *local_138->value;
    }
    if (0 < local_138->n) {
      lVar11 = 1;
      pRVar7 = local_128;
      do {
        local_130 = 0.0;
        local_110 = 0.0;
        pRVar3 = local_d8->real;
        lVar8 = (long)((int)uVar9 * 0xf);
        local_f8 = pRVar3[lVar8];
        local_f0 = pRVar3[lVar8 + 1];
        local_e8 = pRVar3[lVar8 + 2];
        if (ref_geom->model != (void *)0x0) {
          local_100 = uVar9;
          uVar5 = ref_egads_edge_curvature(ref_geom,RVar12,&local_130,local_48);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xbd0,"ref_geom_edge_tec_zone",(ulong)uVar5);
            return uVar5;
          }
          if (local_130 <= -local_130) {
            local_130 = -local_130;
          }
          uVar5 = ref_egads_eval_at(ref_geom,1,id,pRVar7,&local_f8,(REF_DBL *)0x0);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xbd3,"ref_geom_edge_tec_zone",(ulong)uVar5);
            return uVar5;
          }
          uVar5 = ref_egads_gap(ref_geom,(REF_INT)local_100,&local_110);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xbd4,"ref_geom_edge_tec_zone",(ulong)uVar5);
            return uVar5;
          }
        }
        fprintf(local_118," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",local_f8,local_f0,
                local_e8,local_110,*pRVar7,0,local_130,0);
        RVar12 = -1;
        uVar9 = 0xffffffff;
        if (lVar11 < local_138->n) {
          uVar9 = (ulong)(uint)local_138->key[lVar11];
          RVar12 = local_138->value[lVar11];
        }
        pRVar7 = pRVar7 + 1;
        bVar4 = lVar11 < local_138->n;
        lVar11 = lVar11 + 1;
      } while (bVar4);
    }
    iVar13 = (int)local_c0;
    pRVar7 = local_128;
    if (iVar13 != -1) {
      node = ref_geom->descr[(long)(iVar13 * 6) + 5];
      lVar11 = (long)node;
      local_130 = 0.0;
      local_110 = 0.0;
      pRVar7 = local_d8->real;
      local_f8 = pRVar7[lVar11 * 0xf];
      local_f0 = pRVar7[lVar11 * 0xf + 1];
      local_e8 = pRVar7[lVar11 * 0xf + 2];
      if (ref_geom->model != (void *)0x0) {
        uVar5 = ref_egads_edge_curvature(ref_geom,iVar13,&local_130,local_48);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xbe2,"ref_geom_edge_tec_zone",(ulong)uVar5);
          return uVar5;
        }
        if (local_130 <= -local_130) {
          local_130 = -local_130;
        }
        uVar5 = ref_egads_eval_at(ref_geom,1,id,local_128 + (local_d0 - 1),&local_f8,(REF_DBL *)0x0)
        ;
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xbe6,"ref_geom_edge_tec_zone",(ulong)uVar5,"eval at");
          return uVar5;
        }
        uVar5 = ref_egads_gap(ref_geom,node,&local_110);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xbe7,"ref_geom_edge_tec_zone",(ulong)uVar5,"gap");
          return uVar5;
        }
      }
      pRVar7 = local_128;
      fprintf(local_118," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",local_f8,local_f0,
              local_e8,local_110,local_128[local_d0 - 1],0,local_130,0);
    }
    free(pRVar7);
    if (0 < ref_cell->max) {
      local_120 = (ulong)((int)local_120 - 1);
      iVar13 = 0;
      do {
        RVar6 = ref_cell_nodes(ref_cell,iVar13,(REF_INT *)&local_b8);
        if ((RVar6 == 0) && (local_b0 == id)) {
          uVar5 = ref_dict_location(local_138,local_b8,&local_140);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xbf1,"ref_geom_edge_tec_zone",(ulong)uVar5,"localize");
            return uVar5;
          }
          uVar5 = ref_geom_cell_tuv(ref_geom,local_b8,(REF_INT *)&local_b8,1,&local_108,&local_13c);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xbf4,"ref_geom_edge_tec_zone",(ulong)uVar5,"from");
            return uVar5;
          }
          if (local_13c == -1) {
            local_140 = (int)local_120;
          }
          fprintf(local_118," %d",(ulong)(local_140 + 1));
          uVar5 = ref_dict_location(local_138,local_b4,&local_140);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xbf7,"ref_geom_edge_tec_zone",(ulong)uVar5,"localize");
            return uVar5;
          }
          uVar5 = ref_geom_cell_tuv(ref_geom,local_b4,(REF_INT *)&local_b8,1,&local_108,&local_13c);
          __stream = local_118;
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xbfa,"ref_geom_edge_tec_zone",(ulong)uVar5,"from");
            return uVar5;
          }
          if (local_13c == -1) {
            local_140 = (int)local_120;
          }
          fprintf(local_118," %d",(ulong)(local_140 + 1));
          fputc(10,__stream);
        }
        iVar13 = iVar13 + 1;
      } while (iVar13 < ref_cell->max);
    }
    uVar5 = ref_dict_free(local_138);
    if (uVar5 == 0) {
      return 0;
    }
    uVar10 = 0xc01;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar10,
         "ref_geom_edge_tec_zone",(ulong)uVar5,"free dict");
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_geom_edge_tec_zone(REF_GRID ref_grid, REF_INT id,
                                          FILE *file) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_edg(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_DICT ref_dict;
  REF_INT geom, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, local, node;
  REF_INT nnode, nedg, sens;
  REF_INT jump_geom = REF_EMPTY;
  REF_DBL *t, tvalue;
  REF_DBL radius, normal[3], xyz[3], gap;

  RSS(ref_dict_create(&ref_dict), "create dict");

  each_ref_geom_edge(ref_geom, geom) {
    if (id == ref_geom_id(ref_geom, geom)) {
      RSS(ref_dict_store(ref_dict, ref_geom_node(ref_geom, geom), geom),
          "mark nodes");
      if (0 != ref_geom_jump(ref_geom, geom)) {
        REIS(REF_EMPTY, jump_geom, "should be only one jump per edge");
        jump_geom = geom;
      }
    }
  }
  nnode = ref_dict_n(ref_dict);
  if (REF_EMPTY != jump_geom) nnode++;

  nedg = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[2]) {
      nedg++;
    }
  }

  /* skip degenerate */
  if (0 == nnode || 0 == nedg) {
    RSS(ref_dict_free(ref_dict), "free dict");
    return REF_SUCCESS;
  }

  fprintf(
      file,
      "zone t=\"edge%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
      id, nnode, nedg, "point", "felineseg");

  ref_malloc(t, nnode, REF_DBL);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[2]) {
      RSB(ref_dict_location(ref_dict, nodes[0], &local), "localize", {
        printf("edg %d %d id %d no edge geom\n", nodes[0], nodes[1], nodes[2]);
        RSS(ref_node_location(ref_node, nodes[0]), "loc");
        RSS(ref_geom_tattle(ref_geom, nodes[0]), "tatt");
      });
      RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      t[local] = tvalue;
      RSS(ref_dict_location(ref_dict, nodes[1], &local), "localize");
      RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      t[local] = tvalue;
    }
  }

  each_ref_dict_key_value(ref_dict, item, node, geom) {
    radius = 0;
    gap = 0;
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      RSS(ref_egads_edge_curvature(ref_geom, geom, &radius, normal), "curve");
      radius = ABS(radius);
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_EDGE, id, &(t[item]), xyz, NULL),
          "eval at");
      RSS(ref_egads_gap(ref_geom, node, &gap), "gap")
    }
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n", xyz[0],
            xyz[1], xyz[2], gap, t[item], 0.0, radius, 0.0);
  }
  if (REF_EMPTY != jump_geom) {
    node = ref_geom_node(ref_geom, jump_geom);
    radius = 0;
    gap = 0;
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      RSS(ref_egads_edge_curvature(ref_geom, jump_geom, &radius, normal),
          "curve");
      radius = ABS(radius);
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_EDGE, id, &(t[nnode - 1]), xyz,
                            NULL),
          "eval at");
      RSS(ref_egads_gap(ref_geom, node, &gap), "gap")
    }
    node = ref_geom_node(ref_geom, jump_geom);
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n", xyz[0],
            xyz[1], xyz[2], gap, t[nnode - 1], 0.0, radius, 0.0);
  }
  ref_free(t);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[2]) {
      RSS(ref_dict_location(ref_dict, nodes[0], &local), "localize");
      RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      fprintf(file, " %d", local + 1);
      RSS(ref_dict_location(ref_dict, nodes[1], &local), "localize");
      RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      fprintf(file, " %d", local + 1);
      fprintf(file, "\n");
    }
  }

  RSS(ref_dict_free(ref_dict), "free dict");

  return REF_SUCCESS;
}